

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm_bitreader.h
# Opt level: O0

unsigned_long __thiscall LLVMBC::BitReader::vbr<unsigned_long>(BitReader *this,size_t groupBitSize)

{
  byte bVar1;
  uint64_t mask;
  uint64_t shift;
  byte local_28 [6];
  byte lobits;
  byte hibit;
  byte scratch [8];
  uint64_t ret;
  size_t groupBitSize_local;
  BitReader *this_local;
  
  scratch[0] = '\0';
  scratch[1] = '\0';
  scratch[2] = '\0';
  scratch[3] = '\0';
  scratch[4] = '\0';
  scratch[5] = '\0';
  scratch[6] = '\0';
  scratch[7] = '\0';
  if (groupBitSize < 2) {
    __assert_fail("groupBitSize > 1 && \"chunk size must be greater than 1\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_bitreader.h"
                  ,0x61,"T LLVMBC::BitReader::vbr(const size_t) [T = unsigned long]");
  }
  if (8 < groupBitSize) {
    __assert_fail("groupBitSize <= 8 && \"Only chunk sizes up to 8 supported\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_bitreader.h"
                  ,0x62,"T LLVMBC::BitReader::vbr(const size_t) [T = unsigned long]");
  }
  memset(local_28,0,8);
  bVar1 = (byte)(1 << ((char)groupBitSize - 1U & 0x1f));
  mask = 0;
  do {
    ReadBits(this,groupBitSize,local_28);
    if (0x3f < mask) {
      __assert_fail("shift <= 63",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_bitreader.h"
                    ,0x6f,"T LLVMBC::BitReader::vbr(const size_t) [T = unsigned long]");
    }
    scratch = (byte  [8])
              (((long)(int)(uint)(local_28[0] & bVar1 - 1) << ((byte)mask & 0x3f)) + (long)scratch);
    mask = (groupBitSize - 1) + mask;
  } while ((local_28[0] & bVar1) != 0);
  return (unsigned_long)scratch;
}

Assistant:

T vbr(const size_t groupBitSize)
  {
    uint64_t ret = 0;

    assert(groupBitSize > 1 && "chunk size must be greater than 1");
    assert(groupBitSize <= 8 && "Only chunk sizes up to 8 supported");

    // Avoid false positive warning.
    byte scratch[8] = {};

    const byte hibit = 1 << (groupBitSize - 1);
    const byte lobits = hibit - 1;

    uint64_t shift = 0;
    do
    {
      ReadBits(groupBitSize, scratch);

      assert(shift <= 63);

      ret += (uint64_t(scratch[0] & lobits) << shift);

      shift += uint64_t(groupBitSize - 1);
    } while(scratch[0] & hibit);

#ifndef NDEBUG
    // check for overflow of the return type
    const uint64_t mask = ((1ULL << (sizeof(T) * 8 - 1)) - 1) << 1 | 1;
    assert((ret & mask) == ret);
#endif

    return T(ret);
  }